

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_unique_ptr.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  unique_ptr<int,_std::default_delete<int>_> local_90;
  unique_ptr<int,_std::default_delete<int>_> uptr;
  shared_ptr<int> sptr2;
  shared_ptr<int> sptr;
  shared_ptr<TestB> ptr_b;
  shared_ptr<TestA> ptr_a;
  __shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::make_shared<TestA>();
  std::make_shared<TestB>();
  std::__shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&ptr_b.super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2> *)
             ptr_a.super___shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&ptr_a.super___shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2> *)
             ptr_b.super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  uptr._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)operator_new(4);
  *(undefined4 *)
   uptr._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
   super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
   _M_head_impl = 100;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,std::default_delete<int>,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&sptr,&uptr);
  poVar1 = std::operator<<((ostream *)&std::cout,"Smart Ptr test: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::endl<char,std::char_traits<char>>(poVar1);
  smart_ptr_factory();
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,std::default_delete<int>,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&sptr2,&local_90);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_90);
  poVar1 = std::operator<<((ostream *)&std::cout,"Smart Ptr test: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*sptr2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sptr2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&uptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr_b.super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr_a.super___shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main()
{
	std::shared_ptr<TestA> ptr_a = std::make_shared<TestA>();
	std::shared_ptr<TestB> ptr_b = std::make_shared<TestB>();
	ptr_a->ReferTestB(ptr_b);
	ptr_b->ReferTestB(ptr_a);

	// std::unique_ptr<int> uptr(new int(100));
	std::unique_ptr<int> uptr = std::make_unique<int>(100); // C++14
	std::shared_ptr<int> sptr = std::move(uptr);
	// sptr = std::move(uptr);
	std::cout << "Smart Ptr test: " << *sptr << std::endl;

	// return local unique_ptr
	std::shared_ptr<int> sptr2 = smart_ptr_factory();
	std::cout << "Smart Ptr test: " << *sptr2 << std::endl;


	return 0;
}